

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O3

void cf2_doBlend(CFF_Blend blend,CF2_Stack opStack,FT_UFast numBlends)

{
  int iVar1;
  FT_Int32 *pFVar2;
  int *piVar3;
  int iVar4;
  CF2_F16Dot16 CVar5;
  CF2_F16Dot16 CVar6;
  uint uVar7;
  long lVar8;
  CF2_StackNumber *pCVar9;
  ulong uVar10;
  CF2_StackNumber *pCVar11;
  long lVar12;
  FT_UFast idx;
  uint uVar13;
  int iVar14;
  FT_UFast FVar15;
  FT_UFast idx_00;
  
  iVar4 = blend->lenBV * numBlends;
  pCVar11 = opStack->top;
  uVar13 = (uint)((ulong)((long)pCVar11 - (long)opStack->buffer) >> 3);
  if (numBlends != 0) {
    iVar14 = uVar13 - iVar4;
    FVar15 = iVar14 + numBlends;
    uVar10 = 0;
    do {
      pFVar2 = blend->BV;
      idx = iVar14 + (int)uVar10;
      CVar5 = cf2_stack_getReal(opStack,idx);
      if (1 < blend->lenBV) {
        lVar12 = 1;
        idx_00 = FVar15;
        do {
          iVar1 = pFVar2[lVar12];
          FVar15 = idx_00 + 1;
          CVar6 = cf2_stack_getReal(opStack,idx_00);
          lVar8 = (long)CVar6 * (long)iVar1;
          CVar5 = CVar5 + (int)((ulong)(lVar8 + (lVar8 >> 0x3f) + 0x8000) >> 0x10);
          lVar12 = lVar12 + 1;
          idx_00 = FVar15;
        } while ((uint)lVar12 < blend->lenBV);
      }
      pCVar9 = opStack->buffer;
      if ((uint)((ulong)((long)opStack->top - (long)pCVar9) >> 3) < idx) {
        piVar3 = opStack->error;
        if ((piVar3 != (int *)0x0) && (*piVar3 == 0)) {
          *piVar3 = 0x82;
        }
      }
      else {
        pCVar9[idx].u.r = CVar5;
        pCVar9 = opStack->buffer;
        pCVar9[idx].type = CF2_NumberFixed;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != numBlends);
    pCVar11 = opStack->top;
    uVar13 = (uint)((ulong)((long)pCVar11 - (long)pCVar9) >> 3);
  }
  uVar7 = iVar4 - numBlends;
  if (uVar13 < uVar7) {
    piVar3 = opStack->error;
    if ((piVar3 != (int *)0x0) && (*piVar3 == 0)) {
      *piVar3 = 0xa1;
    }
  }
  else {
    opStack->top = pCVar11 + -(ulong)uVar7;
  }
  return;
}

Assistant:

static void
  cf2_doBlend( const CFF_Blend  blend,
               CF2_Stack        opStack,
               CF2_UInt         numBlends )
  {
    CF2_UInt  delta;
    CF2_UInt  base;
    CF2_UInt  i, j;
    CF2_UInt  numOperands = (CF2_UInt)( numBlends * blend->lenBV );


    base  = cf2_stack_count( opStack ) - numOperands;
    delta = base + numBlends;

    for ( i = 0; i < numBlends; i++ )
    {
      const CF2_Fixed*  weight = &blend->BV[1];

      /* start with first term */
      CF2_Fixed  sum = cf2_stack_getReal( opStack, i + base );


      for ( j = 1; j < blend->lenBV; j++ )
        sum = ADD_INT32( sum,
                         FT_MulFix( *weight++,
                                    cf2_stack_getReal( opStack,
                                                       delta++ ) ) );

      /* store blended result  */
      cf2_stack_setReal( opStack, i + base, sum );
    }

    /* leave only `numBlends' results on stack */
    cf2_stack_pop( opStack, numOperands - numBlends );
  }